

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeSortAllocUnpacked(SortSubtask *pTask)

{
  UnpackedRecord *pUVar1;
  SortSubtask *pTask_local;
  
  if (pTask->pUnpacked == (UnpackedRecord *)0x0) {
    pUVar1 = sqlite3VdbeAllocUnpackedRecord(pTask->pSorter->pKeyInfo);
    pTask->pUnpacked = pUVar1;
    if (pTask->pUnpacked == (UnpackedRecord *)0x0) {
      return 7;
    }
    pTask->pUnpacked->nField = pTask->pSorter->pKeyInfo->nKeyField;
    pTask->pUnpacked->errCode = '\0';
  }
  return 0;
}

Assistant:

static int vdbeSortAllocUnpacked(SortSubtask *pTask){
  if( pTask->pUnpacked==0 ){
    pTask->pUnpacked = sqlite3VdbeAllocUnpackedRecord(pTask->pSorter->pKeyInfo);
    if( pTask->pUnpacked==0 ) return SQLITE_NOMEM_BKPT;
    pTask->pUnpacked->nField = pTask->pSorter->pKeyInfo->nKeyField;
    pTask->pUnpacked->errCode = 0;
  }
  return SQLITE_OK;
}